

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O0

int Ifn_NtkMatch(Ifn_Ntk_t *p,word *pTruth,int nVars,int nConfls,int fVerbose,int fVeryVerbose,
                word *pConfig)

{
  int Value;
  int iVar1;
  int iVar2;
  uint uVar3;
  abctime aVar4;
  sat_solver *s;
  abctime aVar5;
  word *pOut;
  char *pcVar6;
  uint local_6c;
  sat_solver *pSat;
  abctime clk;
  int iMint;
  int status;
  int v;
  int i;
  int nIterMax;
  int RetValue;
  word *pTruth1;
  int fVeryVerbose_local;
  int fVerbose_local;
  int nConfls_local;
  int nVars_local;
  word *pTruth_local;
  Ifn_Ntk_t *p_local;
  
  i = 0;
  iVar1 = 1 << ((byte)nVars & 0x1f);
  clk._0_4_ = 0;
  aVar4 = Abc_Clock();
  if (nVars == 0) {
    p_local._4_4_ = 1;
  }
  else {
    s = sat_solver_new();
    Ifn_Prepare(p,pTruth,nVars);
    sat_solver_setnvars(s,p->nPars);
    Ifn_NtkAddConstraints(p,s);
    if (fVeryVerbose != 0) {
      aVar5 = Abc_Clock();
      Ifn_NtkMatchPrintStatus(s,0,1,-1,-1,aVar5 - aVar4);
    }
    if ((pConfig != (word *)0x0) && (*pConfig != 0)) {
      __assert_fail("*pConfig == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                    ,0x541,"int Ifn_NtkMatch(Ifn_Ntk_t *, word *, int, int, int, int, word *)");
    }
    for (status = 0; status < iVar1; status = status + 1) {
      for (iMint = 0; iMint < p->nObjs; iMint = iMint + 1) {
        if (iMint < p->nVars) {
          local_6c = (int)clk >> ((byte)iMint & 0x1f) & 1;
        }
        else {
          local_6c = 0xffffffff;
        }
        p->Values[iMint] = local_6c;
      }
      iVar2 = Abc_TtGetBit(pTruth,(int)clk);
      p->Values[p->nObjs + -1] = iVar2;
      iVar2 = Ifn_NtkAddClauses(p,p->Values,s);
      if (iVar2 == 0) break;
      iVar2 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,(long)nConfls,0,0,0);
      if (fVeryVerbose != 0) {
        Value = p->Values[p->nObjs + -1];
        aVar5 = Abc_Clock();
        Ifn_NtkMatchPrintStatus(s,status + 1,iVar2,(int)clk,Value,aVar5 - aVar4);
      }
      if (iVar2 != 1) break;
      for (iMint = p->nObjs; iMint < p->nPars; iMint = iMint + 1) {
        iVar2 = sat_solver_var_value(s,iMint);
        p->Values[iMint] = iVar2;
      }
      pOut = Ifn_NtkDeriveTruth(p,p->Values);
      Abc_TtXor(pOut,pOut,p->pTruth,p->nWords,0);
      clk._0_4_ = Abc_TtFindFirstBit(pOut,p->nVars);
      if ((int)clk == -1) {
        if (pConfig != (word *)0x0) {
          Ifn_NtkMatchCollectConfig(p,s,pConfig);
        }
        i = 1;
        break;
      }
    }
    if (iVar1 <= status) {
      __assert_fail("i < nIterMax",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                    ,0x56e,"int Ifn_NtkMatch(Ifn_Ntk_t *, word *, int, int, int, int, word *)");
    }
    if (fVerbose != 0) {
      pcVar6 = "no ";
      if (i != 0) {
        pcVar6 = "yes";
      }
      uVar3 = sat_solver_nconflicts(s);
      printf("%s  Iter =%4d. Confl = %6d.  ",pcVar6,(ulong)(uint)status,(ulong)uVar3);
      if (i != 0) {
        Ifn_NtkMatchPrintConfig(p,s);
      }
      printf("\n");
    }
    sat_solver_delete(s);
    p_local._4_4_ = i;
  }
  return p_local._4_4_;
}

Assistant:

int Ifn_NtkMatch( Ifn_Ntk_t * p, word * pTruth, int nVars, int nConfls, int fVerbose, int fVeryVerbose, word * pConfig )
{
    word * pTruth1;
    int RetValue = 0;
    int nIterMax = (1<<nVars);
    int i, v, status, iMint = 0;
    abctime clk = Abc_Clock();
//    abctime clkTru = 0, clkSat = 0, clk2;
    sat_solver * pSat;
    if ( nVars == 0 )
        return 1;
    pSat = sat_solver_new();
    Ifn_Prepare( p, pTruth, nVars );
    sat_solver_setnvars( pSat, p->nPars );
    Ifn_NtkAddConstraints( p, pSat );
    if ( fVeryVerbose )
        Ifn_NtkMatchPrintStatus( pSat, 0, l_True, -1, -1, Abc_Clock() - clk );
    if ( pConfig ) assert( *pConfig == 0 );
    for ( i = 0; i < nIterMax; i++ )
    {
        // get variable assignment
        for ( v = 0; v < p->nObjs; v++ )
            p->Values[v] = v < p->nVars ? (iMint >> v) & 1 :  -1;
        p->Values[p->nObjs-1] = Abc_TtGetBit( pTruth, iMint );
        // derive clauses
        if ( !Ifn_NtkAddClauses( p, p->Values, pSat ) )
            break;
        // find assignment of parameters
//        clk2 = Abc_Clock();
        status = sat_solver_solve( pSat, NULL, NULL, nConfls, 0, 0, 0 );
//        clkSat += Abc_Clock() - clk2;
        if ( fVeryVerbose )
            Ifn_NtkMatchPrintStatus( pSat, i+1, status, iMint, p->Values[p->nObjs-1], Abc_Clock() - clk );
        if ( status != l_True )
            break;
        // collect assignment
        for ( v = p->nObjs; v < p->nPars; v++ )
            p->Values[v] = sat_solver_var_value(pSat, v);
        // find truth table
//        clk2 = Abc_Clock();
        pTruth1 = Ifn_NtkDeriveTruth( p, p->Values );
//        clkTru += Abc_Clock() - clk2;
        Abc_TtXor( pTruth1, pTruth1, p->pTruth, p->nWords, 0 );
        // find mismatch if present
        iMint = Abc_TtFindFirstBit( pTruth1, p->nVars );
        if ( iMint == -1 )
        {
            if ( pConfig ) 
                Ifn_NtkMatchCollectConfig( p, pSat, pConfig );
/*
            if ( pPerm )
            {
                int RetValue = Ifn_ManSatFindCofigBitsTest( p, pTruth, nVars, *pPerm );
                Ifn_NtkMatchPrintPerm( *pPerm, p->nInps );
                if ( RetValue == 0 )
                    printf( "Verification failed.\n" );
            }
*/
            RetValue = 1;
            break;
        }
    }
    assert( i < nIterMax );
    if ( fVerbose )
    {
        printf( "%s  Iter =%4d. Confl = %6d.  ", RetValue ? "yes":"no ", i, sat_solver_nconflicts(pSat) );
        if ( RetValue )
            Ifn_NtkMatchPrintConfig( p, pSat );
        printf( "\n" );
    }
    sat_solver_delete( pSat );
//    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
//    Abc_PrintTime( 1, "Sat", clkSat );
//    Abc_PrintTime( 1, "Tru", clkTru );
    return RetValue;
}